

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s1chord_angle.cc
# Opt level: O0

void __thiscall S1ChordAngle::S1ChordAngle(S1ChordAngle *this,S1Angle angle)

{
  bool bVar1;
  double *pdVar2;
  ostream *poVar3;
  double dVar4;
  S2LogMessage local_68;
  S2LogMessageVoidify local_51;
  double local_50;
  double local_48;
  double local_40;
  double length;
  double local_30;
  S1Angle local_28;
  double local_20;
  S1ChordAngle *local_18;
  S1ChordAngle *this_local;
  S1Angle angle_local;
  
  local_18 = this;
  this_local = (S1ChordAngle *)angle.radians_;
  dVar4 = S1Angle::radians((S1Angle *)&this_local);
  if (0.0 <= dVar4) {
    local_28.radians_ = (double)this_local;
    local_30 = (double)S1Angle::Infinity();
    bVar1 = ::operator==(local_28,(S1Angle)local_30);
    if (bVar1) {
      length = (double)Infinity();
      this->length2_ = length;
    }
    else {
      local_48 = 3.141592653589793;
      local_50 = S1Angle::radians((S1Angle *)&this_local);
      pdVar2 = std::min<double>(&local_48,&local_50);
      local_40 = sin(*pdVar2 * 0.5);
      local_40 = local_40 * 2.0;
      this->length2_ = local_40 * local_40;
    }
  }
  else {
    local_20 = (double)Negative();
    this->length2_ = local_20;
  }
  bVar1 = is_valid(this);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_68,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s1chord_angle.cc"
               ,0x30,kFatal,(ostream *)&std::cerr);
    poVar3 = S2LogMessage::stream(&local_68);
    poVar3 = std::operator<<(poVar3,"Check failed: is_valid() ");
    S2LogMessageVoidify::operator&(&local_51,poVar3);
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_68);
  }
  return;
}

Assistant:

S1ChordAngle::S1ChordAngle(S1Angle angle) {
  if (angle.radians() < 0) {
    *this = Negative();
  } else if (angle == S1Angle::Infinity()) {
    *this = Infinity();
  } else {
    // The chord length is 2 * sin(angle / 2).
    double length = 2 * sin(0.5 * min(M_PI, angle.radians()));
    length2_ = length * length;
  }
  S2_DCHECK(is_valid());
}